

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHttp_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamHttp::BamHttp(BamHttp *this,string *url)

{
  void *pvVar1;
  undefined8 *in_RDI;
  string *in_stack_00000068;
  BamHttp *in_stack_00000070;
  TcpSocket *this_00;
  
  IBamIODevice::IBamIODevice((IBamIODevice *)0x2a28bd);
  *in_RDI = &PTR__BamHttp_0033f740;
  this_00 = (TcpSocket *)(in_RDI + 6);
  pvVar1 = operator_new(0x120);
  TcpSocket::TcpSocket(this_00);
  *(void **)this_00 = pvVar1;
  std::__cxx11::string::string((string *)(in_RDI + 7));
  std::__cxx11::string::string((string *)(in_RDI + 0xb),(string *)HTTP_PORT_abi_cxx11_);
  std::__cxx11::string::string((string *)(in_RDI + 0xf));
  in_RDI[0x13] = 0;
  in_RDI[0x14] = 0;
  *(undefined1 *)(in_RDI + 0x15) = 0;
  in_RDI[0x16] = 0xffffffffffffffff;
  in_RDI[0x17] = 0xffffffffffffffff;
  in_RDI[0x18] = 0xffffffffffffffff;
  ParseUrl(in_stack_00000070,in_stack_00000068);
  return;
}

Assistant:

BamHttp::BamHttp(const std::string& url)
    : IBamIODevice()
    , m_socket(new TcpSocket)
    , m_port(HTTP_PORT)
    , m_request(0)
    , m_response(0)
    , m_isUrlParsed(false)
    , m_filePosition(-1)
    , m_fileEndPosition(-1)
    , m_rangeEndPosition(-1)
{
    ParseUrl(url);
}